

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O2

void __thiscall MppMemService::dump(MppMemService *this,char *caller)

{
  MppMemNode *pMVar1;
  MppMemLog *pMVar2;
  int iVar3;
  char **ppcVar4;
  int iVar5;
  bool bVar6;
  
  pMVar1 = this->nodes;
  _mpp_log_l(4,"mpp_mem","mpp_mem enter status dumping from %s:\n",(char *)0x0,caller);
  _mpp_log_l(4,"mpp_mem","mpp_mem node count %d:\n",(char *)0x0,(ulong)(uint)this->nodes_cnt);
  if (this->nodes_cnt != 0) {
    ppcVar4 = &pMVar1->caller;
    for (iVar5 = 0; iVar5 < this->nodes_max; iVar5 = iVar5 + 1) {
      if (-1 < ((MppMemNode *)(ppcVar4 + -3))->index) {
        _mpp_log_l(4,"mpp_mem","mpp_memory index %d caller %-32s size %-8u ptr %p\n",(char *)0x0,
                   (ulong)(uint)((MppMemNode *)(ppcVar4 + -3))->index,*ppcVar4,ppcVar4[-2],
                   ppcVar4[-1]);
      }
      ppcVar4 = ppcVar4 + 4;
    }
  }
  pMVar1 = this->frees;
  _mpp_log_l(4,"mpp_mem","mpp_mem free count %d:\n",(char *)0x0,(ulong)(uint)this->frees_cnt);
  if (this->frees_cnt != 0) {
    ppcVar4 = &pMVar1->caller;
    for (iVar5 = 0; iVar5 < this->frees_max; iVar5 = iVar5 + 1) {
      if (-1 < ((MppMemNode *)(ppcVar4 + -3))->index) {
        _mpp_log_l(4,"mpp_mem","mpp_freed  index %d caller %-32s size %-8u ptr %p\n",(char *)0x0,
                   (ulong)(uint)((MppMemNode *)(ppcVar4 + -3))->index,*ppcVar4,ppcVar4[-2],
                   ppcVar4[-1]);
      }
      ppcVar4 = ppcVar4 + 4;
    }
  }
  iVar5 = this->log_cnt;
  iVar3 = this->log_idx - iVar5;
  iVar3 = (iVar3 >> 0x1f & this->log_max) + iVar3;
  _mpp_log_l(4,"mpp_mem","mpp_mem enter log dumping:\n",(char *)0x0);
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    pMVar2 = this->logs;
    _mpp_log_l(4,"mpp_mem","idx %-8d op: %-7s from %-32s ptr %10p %10p size %7d %7d\n",(char *)0x0,
               (ulong)pMVar2[iVar3].index,ops2str[pMVar2[iVar3].ops],pMVar2[iVar3].caller,
               pMVar2[iVar3].ptr,pMVar2[iVar3].ret,pMVar2[iVar3].size_0,pMVar2[iVar3].size_1);
    iVar3 = iVar3 + 1;
    if (this->log_max <= iVar3) {
      iVar3 = 0;
    }
  }
  return;
}

Assistant:

void MppMemService::dump(const char *caller)
{
    RK_S32 i;
    MppMemNode *node = nodes;

    mpp_log("mpp_mem enter status dumping from %s:\n", caller);

    mpp_log("mpp_mem node count %d:\n", nodes_cnt);
    if (nodes_cnt) {
        for (i = 0; i < nodes_max; i++, node++) {
            if (node->index < 0)
                continue;

            mpp_log("mpp_memory index %d caller %-32s size %-8u ptr %p\n",
                    node->index, node->caller, node->size, node->ptr);
        }
    }

    node = frees;
    mpp_log("mpp_mem free count %d:\n", frees_cnt);
    if (frees_cnt) {
        for (i = 0; i < frees_max; i++, node++) {
            if (node->index < 0)
                continue;

            mpp_log("mpp_freed  index %d caller %-32s size %-8u ptr %p\n",
                    node->index, node->caller, node->size, node->ptr);
        }
    }

    RK_S32 start = log_idx - log_cnt;
    RK_S32 tmp_cnt = log_cnt;

    if (start < 0)
        start += log_max;

    mpp_log("mpp_mem enter log dumping:\n");

    while (tmp_cnt) {
        MppMemLog *log = &logs[start];

        mpp_log("idx %-8d op: %-7s from %-32s ptr %10p %10p size %7d %7d\n",
                log->index, ops2str[log->ops], log->caller,
                log->ptr, log->ret, log->size_0, log->size_1);

        start++;
        if (start >= log_max)
            start = 0;

        tmp_cnt--;
    }
}